

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O0

void FENToHash(char *fen,string *move_s)

{
  int iVar1;
  long lVar2;
  ulong in_RSI;
  char *in_RDI;
  bool bVar3;
  UINT32 place;
  int no_piece;
  int piece_id;
  int piece_id_index;
  int row;
  int col;
  int piece_id_array [14];
  char *p;
  string local_a0 [36];
  Movement local_7c;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58 [2];
  string *in_stack_ffffffffffffffb0;
  char *local_18;
  
  memcpy(local_58,&DAT_00119010,0x38);
  local_5c = GetCol(0x33);
  local_60 = GetRow(0x33);
  for (local_18 = in_RDI; *local_18 != ' '; local_18 = local_18 + 1) {
    if (*local_18 == '/') {
      local_5c = 3;
      local_60 = local_60 + 1;
    }
    else if ((*local_18 < '1') || ('9' < *local_18)) {
      local_64 = PieceOfFen(*local_18);
      local_68 = local_58[local_64];
      lVar2 = (long)local_68;
      iVar1 = GetPosition(local_5c,local_60);
      BookZobristKey = ZobristTable[lVar2][iVar1] ^ BookZobristKey;
      lVar2 = (long)local_68;
      iVar1 = GetPosition(local_5c,local_60);
      BookZobristKeyCheck = ZobristTableCheck[lVar2][iVar1] ^ BookZobristKeyCheck;
      local_58[local_64] = local_58[local_64] + 1;
      local_5c = local_5c + 1;
    }
    else {
      local_6c = *local_18 + -0x30;
      local_5c = local_6c + local_5c;
    }
  }
  if (local_18[1] == 'w') {
    BookZobristKey = ZobristPlayer ^ BookZobristKey;
    BookZobristKeyCheck = ZobristPlayerCheck ^ BookZobristKeyCheck;
  }
  local_70 = (uint)BookZobristKey;
  while( true ) {
    local_70 = local_70 & 0xfffff;
    bVar3 = false;
    if (BookHashTable[local_70].check != 0) {
      bVar3 = BookHashTable[local_70].check != BookZobristKeyCheck;
    }
    if (!bVar3) break;
    local_70 = local_70 + 1;
  }
  if (BookHashTable[local_70].check == 0) {
    BookHashTable[local_70].check = BookZobristKeyCheck;
    std::__cxx11::string::substr((ulong)local_a0,in_RSI);
    local_7c = StrToMovement(in_stack_ffffffffffffffb0);
    BookHashTable[local_70].move = local_7c;
    std::__cxx11::string::~string(local_a0);
  }
  return;
}

Assistant:

void FENToHash(const char* fen, string move_s){
    const char *p = fen;
    int piece_id_array[14] = {16, 17, 19, 21, 23, 25, 27, 32, 33, 35, 37, 39, 41, 43};
    int col = GetCol(BOARD_FIRST_POSITION), row = GetRow(BOARD_FIRST_POSITION), piece_id_index, piece_id;

    while(*p != ' '){
        if(*p == '/'){
            col = 3;
            row ++;
        }
        else if(*p > '0' && *p <= '9'){
            int no_piece = *p - '0';
            col += no_piece;
        }
        else{
            piece_id_index = PieceOfFen(*p);
            piece_id = piece_id_array[piece_id_index];
            BookZobristKey ^= ZobristTable[piece_id][GetPosition(col, row)];
            BookZobristKeyCheck ^= ZobristTableCheck[piece_id][GetPosition(col, row)];

            piece_id_array[piece_id_index] ++;
            col ++;
        }
        p ++;
    }
    p ++;   // *p = side
    if(*p == 'w'){
        BookZobristKey ^= ZobristPlayer;
        BookZobristKeyCheck ^= ZobristPlayerCheck;
    }

    UINT32 place;
    place = BookZobristKey & BOOK_HASHTABLE_MASK;
    while(BookHashTable[place].check && BookHashTable[place].check != BookZobristKeyCheck)  // 存着不同的局面，遇到冲突，线性探测再散列
        place = (place + 1) & BOOK_HASHTABLE_MASK;

    if(!BookHashTable[place].check){                            // 位置为空，存入哈希表
        BookHashTable[place].check = BookZobristKeyCheck;
        BookHashTable[place].move = StrToMovement(move_s.substr(0, 4));
    }
}